

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O3

bool __thiscall Json::OurReader::readObject(OurReader *this,Token *tokenStart)

{
  iterator *piVar1;
  ValueHolder *pVVar2;
  TokenType TVar3;
  bool bVar4;
  char *pcVar5;
  Value *pVVar6;
  _Elt_pointer ppVVar7;
  long *plVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  Value numberName;
  string name;
  Token comma;
  Token tokenName;
  Token colon;
  ValueHolder local_f0;
  ulong local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  undefined8 local_d0;
  string local_c8;
  string local_a8;
  Token local_88;
  ValueHolder local_70;
  ushort local_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  Token local_48;
  
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  local_c8._M_string_length = 0;
  local_c8.field_2._M_local_buf[0] = '\0';
  local_50 = 0;
  local_60 = 0;
  uStack_58 = 0;
  pcVar5 = (char *)operator_new(0x30);
  pcVar5[0x10] = '\0';
  pcVar5[0x11] = '\0';
  pcVar5[0x12] = '\0';
  pcVar5[0x13] = '\0';
  pcVar5[0x14] = '\0';
  pcVar5[0x15] = '\0';
  pcVar5[0x16] = '\0';
  pcVar5[0x17] = '\0';
  pcVar5[0x18] = '\0';
  pcVar5[0x19] = '\0';
  pcVar5[0x1a] = '\0';
  pcVar5[0x1b] = '\0';
  pcVar5[0x1c] = '\0';
  pcVar5[0x1d] = '\0';
  pcVar5[0x1e] = '\0';
  pcVar5[0x1f] = '\0';
  pcVar5[0] = '\0';
  pcVar5[1] = '\0';
  pcVar5[2] = '\0';
  pcVar5[3] = '\0';
  pcVar5[4] = '\0';
  pcVar5[5] = '\0';
  pcVar5[6] = '\0';
  pcVar5[7] = '\0';
  pcVar5[8] = '\0';
  pcVar5[9] = '\0';
  pcVar5[10] = '\0';
  pcVar5[0xb] = '\0';
  pcVar5[0xc] = '\0';
  pcVar5[0xd] = '\0';
  pcVar5[0xe] = '\0';
  pcVar5[0xf] = '\0';
  *(char **)(pcVar5 + 0x18) = pcVar5 + 8;
  *(char **)(pcVar5 + 0x20) = pcVar5 + 8;
  pcVar5[0x28] = '\0';
  pcVar5[0x29] = '\0';
  pcVar5[0x2a] = '\0';
  pcVar5[0x2b] = '\0';
  pcVar5[0x2c] = '\0';
  pcVar5[0x2d] = '\0';
  pcVar5[0x2e] = '\0';
  pcVar5[0x2f] = '\0';
  ppVVar7 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVVar7 ==
      (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppVVar7 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  pVVar6 = ppVVar7[-1];
  local_68 = *(ushort *)&pVVar6->field_0x8;
  local_70.map_ = *(ObjectValues **)&pVVar6->value_;
  (pVVar6->value_).string_ = pcVar5;
  *(ushort *)&pVVar6->field_0x8 = local_68 & 0xfe00 | 7;
  local_68 = local_68 & 0x1ff;
  ppVVar7 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVVar7 ==
      (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppVVar7 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  ppVVar7[-1]->start_ = (long)tokenStart->start_ - (long)this->begin_;
  do {
    readToken(this,&local_88);
    while (TVar3 = local_88.type_, local_88.type_ == tokenComment) {
      readToken(this,&local_88);
    }
    if ((local_88.type_ == tokenObjectEnd) && ((char *)local_c8._M_string_length == (char *)0x0))
    break;
    std::__cxx11::string::_M_replace((ulong)&local_c8,0,(char *)local_c8._M_string_length,0x120b2a);
    if (TVar3 == tokenNumber) {
      if ((this->features_).allowNumericKeys_ != true) goto LAB_0010ec77;
      local_e8 = local_e8 & 0xfffffffffffffe00;
      local_e0._M_allocated_capacity = 0;
      local_e0._8_8_ = 0;
      local_d0 = 0;
      bVar4 = decodeNumber(this,&local_88,(Value *)&local_f0);
      if (bVar4) {
        Value::asString_abi_cxx11_(&local_a8,(Value *)&local_f0);
        std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_a8._M_dataplus._M_p._4_4_,(uint)local_a8._M_dataplus._M_p) !=
            &local_a8.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_a8._M_dataplus._M_p._4_4_,(uint)local_a8._M_dataplus._M_p))
          ;
        }
        Value::~Value((Value *)&local_f0);
        goto LAB_0010eb47;
      }
      recoverFromError(this,tokenObjectEnd);
      Value::~Value((Value *)&local_f0);
LAB_0010ee3f:
      bVar4 = false;
      goto LAB_0010ee41;
    }
    if (TVar3 != tokenString) {
LAB_0010ec77:
      local_f0.string_ = (char *)&local_e0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f0,"Missing \'}\' or object member name","");
      addError(this,(string *)&local_f0,&local_88,(Location)0x0);
      recoverFromError(this,tokenObjectEnd);
LAB_0010ee2b:
      if (local_f0 != &local_e0) {
        operator_delete(local_f0.string_);
      }
      goto LAB_0010ee3f;
    }
    bVar4 = decodeString(this,&local_88,&local_c8);
    if (!bVar4) {
      recoverFromError(this,tokenObjectEnd);
      goto LAB_0010ee3f;
    }
LAB_0010eb47:
    readToken(this,&local_48);
    if (local_48.type_ != tokenMemberSeparator) {
      local_f0.string_ = (char *)&local_e0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f0,"Missing \':\' after object member name","");
      addError(this,(string *)&local_f0,&local_48,(Location)0x0);
      recoverFromError(this,tokenObjectEnd);
      goto LAB_0010ee2b;
    }
    if ((char *)0x3fffffff < local_c8._M_string_length) {
      local_f0.string_ = (char *)&local_e0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"keylength >= 2^30","");
      throwRuntimeError((string *)&local_f0);
    }
    if ((this->features_).rejectDupKeys_ == true) {
      ppVVar7 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (ppVVar7 ==
          (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
          super__Deque_impl_data._M_finish._M_first) {
        ppVVar7 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
      }
      pVVar6 = Value::find(ppVVar7[-1],local_c8._M_dataplus._M_p,
                           (char *)(local_c8._M_string_length + (long)local_c8._M_dataplus._M_p));
      if (pVVar6 != (Value *)0x0) {
        std::operator+(&local_a8,"Duplicate key: \'",&local_c8);
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_a8);
        local_f0.string_ = (char *)&local_e0;
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 == paVar9) {
          local_e0._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_e0._8_8_ = plVar8[3];
        }
        else {
          local_e0._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_f0.string_ = ((char *)*plVar8).string_;
        }
        local_e8 = plVar8[1];
        *plVar8 = (long)paVar9;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_a8._M_dataplus._M_p._4_4_,(uint)local_a8._M_dataplus._M_p) !=
            &local_a8.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_a8._M_dataplus._M_p._4_4_,(uint)local_a8._M_dataplus._M_p))
          ;
        }
        addError(this,(string *)&local_f0,&local_88,(Location)0x0);
        recoverFromError(this,tokenObjectEnd);
        goto LAB_0010ee2b;
      }
    }
    ppVVar7 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar7 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar7 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    local_f0.map_ =
         (ObjectValues *)
         Value::resolveReference
                   (ppVVar7[-1],local_c8._M_dataplus._M_p,
                    (char *)(local_c8._M_string_length + (long)local_c8._M_dataplus._M_p));
    pVVar2 = (ValueHolder *)
             (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pVVar2 == (ValueHolder *)
                  ((this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_last + -1)) {
      std::deque<Json::Value*,std::allocator<Json::Value*>>::_M_push_back_aux<Json::Value*>
                ((deque<Json::Value*,std::allocator<Json::Value*>> *)this,(Value **)&local_f0.map_);
    }
    else {
      pVVar2->map_ = (ObjectValues *)local_f0;
      piVar1 = &(this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish;
      piVar1->_M_cur = piVar1->_M_cur + 1;
    }
    bVar4 = readValue(this);
    std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>::pop_back
              ((deque<Json::Value_*,_std::allocator<Json::Value_*>_> *)this);
    if (!bVar4) {
      recoverFromError(this,tokenObjectEnd);
      goto LAB_0010ee3f;
    }
    readToken(this,(Token *)&local_a8);
    if ((0xf < (uint)local_a8._M_dataplus._M_p) ||
       ((0xa004U >> ((uint)local_a8._M_dataplus._M_p & 0x1f) & 1) == 0)) {
      local_f0.string_ = (char *)&local_e0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f0,"Missing \',\' or \'}\' in object declaration","");
      addError(this,(string *)&local_f0,(Token *)&local_a8,(Location)0x0);
      recoverFromError(this,tokenObjectEnd);
      goto LAB_0010ee2b;
    }
    while ((uint)local_a8._M_dataplus._M_p == 0xf) {
      readToken(this,(Token *)&local_a8);
    }
  } while ((uint)local_a8._M_dataplus._M_p != 2);
  bVar4 = true;
LAB_0010ee41:
  Value::~Value((Value *)&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  return bVar4;
}

Assistant:

bool OurReader::readObject(Token& tokenStart) {
  Token tokenName;
  JSONCPP_STRING name;
  Value init(objectValue);
  currentValue().swapPayload(init);
  currentValue().setOffsetStart(tokenStart.start_ - begin_);
  while (readToken(tokenName)) {
    bool initialTokenOk = true;
    while (tokenName.type_ == tokenComment && initialTokenOk)
      initialTokenOk = readToken(tokenName);
    if (!initialTokenOk)
      break;
    if (tokenName.type_ == tokenObjectEnd && name.empty()) // empty object
      return true;
    name = "";
    if (tokenName.type_ == tokenString) {
      if (!decodeString(tokenName, name))
        return recoverFromError(tokenObjectEnd);
    } else if (tokenName.type_ == tokenNumber && features_.allowNumericKeys_) {
      Value numberName;
      if (!decodeNumber(tokenName, numberName))
        return recoverFromError(tokenObjectEnd);
      name = numberName.asString();
    } else {
      break;
    }

    Token colon;
    if (!readToken(colon) || colon.type_ != tokenMemberSeparator) {
      return addErrorAndRecover(
          "Missing ':' after object member name", colon, tokenObjectEnd);
    }
    if (name.length() >= (1U<<30)) throwRuntimeError("keylength >= 2^30");
    if (features_.rejectDupKeys_ && currentValue().isMember(name)) {
      JSONCPP_STRING msg = "Duplicate key: '" + name + "'";
      return addErrorAndRecover(
          msg, tokenName, tokenObjectEnd);
    }
    Value& value = currentValue()[name];
    nodes_.push(&value);
    bool ok = readValue();
    nodes_.pop();
    if (!ok) // error already set
      return recoverFromError(tokenObjectEnd);

    Token comma;
    if (!readToken(comma) ||
        (comma.type_ != tokenObjectEnd && comma.type_ != tokenArraySeparator &&
         comma.type_ != tokenComment)) {
      return addErrorAndRecover(
          "Missing ',' or '}' in object declaration", comma, tokenObjectEnd);
    }
    bool finalizeTokenOk = true;
    while (comma.type_ == tokenComment && finalizeTokenOk)
      finalizeTokenOk = readToken(comma);
    if (comma.type_ == tokenObjectEnd)
      return true;
  }
  return addErrorAndRecover(
      "Missing '}' or object member name", tokenName, tokenObjectEnd);
}